

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::Execute
          (SplitLargeMeshesProcess_Vertex *this,aiScene *pScene)

{
  Logger *pLVar1;
  ulong uVar2;
  long lVar3;
  aiMesh **ppaVar4;
  uint a;
  ulong uVar5;
  uint i;
  pointer ppVar6;
  uint a_1;
  pointer ppVar7;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  avList;
  _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_38;
  
  if ((pScene == (aiScene *)0x0) || (this->LIMIT == 0xffffffff)) {
    return;
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"SplitLargeMeshesProcess_Vertex begin");
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = (ulong)pScene->mNumMeshes;
  uVar5 = 0;
  while (uVar2 != uVar5) {
    ppaVar4 = pScene->mMeshes + uVar5;
    uVar5 = uVar5 + 1;
    if ((*ppaVar4)->mPrimitiveTypes == 1) goto LAB_003bada0;
  }
  for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    SplitMesh(this,(uint)uVar5,pScene->mMeshes[uVar5],
              (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *)&local_38);
    uVar2 = (ulong)pScene->mNumMeshes;
  }
  lVar3 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
          (long)local_38._M_impl.super__Vector_impl_data._M_start;
  uVar5 = lVar3 >> 4;
  if (uVar5 == uVar2) {
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
  }
  else {
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
      lVar3 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38._M_impl.super__Vector_impl_data._M_start;
      uVar5 = lVar3 >> 4;
    }
    ppVar7 = local_38._M_impl.super__Vector_impl_data._M_finish;
    ppVar6 = local_38._M_impl.super__Vector_impl_data._M_start;
    pScene->mNumMeshes = (uint)uVar5;
    ppaVar4 = (aiMesh **)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | lVar3 >> 1);
    pScene->mMeshes = ppaVar4;
    for (uVar2 = 0; uVar2 < (ulong)((long)ppVar7 - (long)ppVar6 >> 4);
        uVar2 = (ulong)((int)uVar2 + 1)) {
      pScene->mMeshes[uVar2] = ppVar6[uVar2].first;
      ppVar6 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = local_38._M_impl.super__Vector_impl_data._M_finish;
    }
    SplitLargeMeshesProcess_Triangle::UpdateNode
              (pScene->mRootNode,
               (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                *)&local_38);
    pLVar1 = DefaultLogger::get();
    Logger::info(pLVar1,"SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
  }
LAB_003bada0:
  std::
  _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::Execute( aiScene* pScene) {
    if (0xffffffff == this->LIMIT || nullptr == pScene ) {
        return;
    }

    ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex begin");

    std::vector<std::pair<aiMesh*, unsigned int> > avList;

    //Check for point cloud first, 
    //Do not process point cloud, splitMesh works only with faces data
    for (unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        if ( pScene->mMeshes[a]->mPrimitiveTypes == aiPrimitiveType_POINT ) {
            return;
        }
    }

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ) {
        this->SplitMesh(a, pScene->mMeshes[a], avList);
    }

    if (avList.size() != pScene->mNumMeshes) {
        // it seems something has been split. rebuild the mesh list
        delete[] pScene->mMeshes;
        pScene->mNumMeshes = (unsigned int)avList.size();
        pScene->mMeshes = new aiMesh*[avList.size()];

        for (unsigned int i = 0; i < avList.size();++i) {
            pScene->mMeshes[i] = avList[i].first;
        }

        // now we need to update all nodes
        SplitLargeMeshesProcess_Triangle::UpdateNode(pScene->mRootNode,avList);
        ASSIMP_LOG_INFO("SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
    } else {
        ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
    }
}